

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fiowfda(osfildef *fp,vocddef *p,uint cnt)

{
  uint16_t tmp;
  size_t sVar1;
  uint uVar2;
  uint *puVar3;
  uchar buf [14];
  undefined2 local_36;
  objnum local_34;
  byte local_32;
  undefined4 local_31;
  prpnum local_2d;
  undefined2 local_2b;
  
  if (cnt != 0) {
    puVar3 = &p->vocdtim;
    uVar2 = 0;
    do {
      if (((vocddef *)(puVar3 + -7))->vocdfn != 0xffff) {
        local_36 = (undefined2)uVar2;
        local_32 = ((runsdef *)(puVar3 + -5))->runstyp;
        if (local_32 < 10) {
          if (local_32 == 1) {
            local_31 = *(undefined4 *)(puVar3 + -3);
          }
          else if (local_32 == 2) goto LAB_0012b144;
        }
        else if ((local_32 == 10) || (local_32 == 0xd)) {
LAB_0012b144:
          local_31 = CONCAT22(local_31._2_2_,
                              ((anon_union_8_4_1dda36f5_for_runsv *)(puVar3 + -3))->runsvobj);
        }
        local_2d = *(prpnum *)(puVar3 + -1);
        local_2b = (undefined2)*puVar3;
        local_34 = ((vocddef *)(puVar3 + -7))->vocdfn;
        sVar1 = fwrite(&local_36,0xd,1,(FILE *)fp);
        if (sVar1 != 1) {
          return 1;
        }
      }
      uVar2 = uVar2 + 1;
      puVar3 = puVar3 + 8;
    } while (cnt != uVar2);
  }
  local_36 = 0xffff;
  sVar1 = fwrite(&local_36,0xd,1,(FILE *)fp);
  return (uint)(sVar1 != 1);
}

Assistant:

static int fiowfda(osfildef *fp, vocddef *p, uint cnt)
{
    uchar buf[14];
    uint  i;
    
    for (i = 0 ; i < cnt ; ++i, ++p)
    {
        if (p->vocdfn == MCMONINV) continue;            /* not set - ignore */
        
        oswp2(buf, i);                        /* element in array to be set */
        oswp2(buf+2, p->vocdfn);       /* object number for function/target */
        buf[4] = p->vocdarg.runstyp;                    /* type of argument */
        switch(buf[4])
        {
        case DAT_NUMBER:
            oswp4s(buf+5, p->vocdarg.runsv.runsvnum);
            break;
        case DAT_OBJECT:
        case DAT_FNADDR:
            oswp2(buf+5, p->vocdarg.runsv.runsvobj);
            break;
        case DAT_PROPNUM:
            oswp2(buf+5, p->vocdarg.runsv.runsvprp);
            break;
        }
        oswp2(buf+9, p->vocdprp);
        oswp2(buf+11, p->vocdtim);
        
        /* write this record to file */
        if (osfwb(fp, buf, 13)) return(TRUE);
    }
    
    /* write end record - -1 for array element number */
    oswp2(buf, 0xffff);
    return(osfwb(fp, buf, 13));
}